

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O0

int32_t __thiscall
xla::GraphCycles::ContractEdge(GraphCycles *this,int32_t a,int32_t b,bool *success)

{
  __node_base_ptr *this_00;
  bool bVar1;
  reference pvVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  vector<int,_std::allocator<int>_> *pvVar7;
  reference pvVar8;
  reference piVar9;
  const_iterator cStack_158;
  int32_t y_3;
  const_iterator __end1_3;
  const_iterator __begin1_3;
  vector<int,_std::allocator<int>_> *__range1_3;
  const_iterator cStack_138;
  int32_t y_2;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  vector<int,_std::allocator<int>_> *__range1_2;
  const_iterator cStack_118;
  int32_t y_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<int,_std::allocator<int>_> *__range1_1;
  const_iterator cStack_f8;
  int32_t y;
  const_iterator __end1;
  const_iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  OrderedNodeSet in;
  OrderedNodeSet out;
  NodeIO *nb_io;
  bool *success_local;
  int32_t b_local;
  int32_t a_local;
  GraphCycles *this_local;
  
  success_local._0_4_ = b;
  success_local._4_4_ = a;
  _b_local = this;
  bVar1 = HasEdge(this,a,b);
  if (!bVar1) {
    __assert_fail("HasEdge(a, b) && \"No edge exists from a to b\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/oneapi-src[P]level-zero/third_party/xla/graphcycles.cc"
                  ,0x1bc,"int32_t xla::GraphCycles::ContractEdge(int32_t, int32_t, bool &)");
  }
  RemoveEdge(this,success_local._4_4_,(int32_t)success_local);
  bVar1 = IsReachableNonConst(this,success_local._4_4_,(int32_t)success_local);
  if (bVar1) {
    InsertEdge(this,success_local._4_4_,(int32_t)success_local);
    *success = false;
    this_local._4_4_ = -1;
  }
  else {
    pvVar2 = std::
             vector<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
             ::operator[](&this->rep_->node_io_,(long)(int32_t)success_local);
    sVar3 = OrderedSet<int>::Size(&pvVar2->in);
    pvVar2 = std::
             vector<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
             ::operator[](&this->rep_->node_io_,(long)(int32_t)success_local);
    sVar4 = OrderedSet<int>::Size(&pvVar2->out);
    pvVar2 = std::
             vector<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
             ::operator[](&this->rep_->node_io_,(long)success_local._4_4_);
    sVar5 = OrderedSet<int>::Size(&pvVar2->in);
    pvVar2 = std::
             vector<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
             ::operator[](&this->rep_->node_io_,(long)success_local._4_4_);
    sVar6 = OrderedSet<int>::Size(&pvVar2->out);
    if (sVar5 + sVar6 < sVar3 + sVar4) {
      std::swap<int>((int *)((long)&success_local + 4),(int *)&success_local);
    }
    pvVar2 = std::
             vector<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
             ::operator[](&this->rep_->node_io_,(long)(int32_t)success_local);
    this_00 = &in.value_to_index_._M_h._M_single_bucket;
    OrderedSet<int>::OrderedSet((OrderedSet<int> *)this_00,&pvVar2->out);
    OrderedSet<int>::OrderedSet((OrderedSet<int> *)&__range1,&pvVar2->in);
    pvVar7 = OrderedSet<int>::GetSequence((OrderedSet<int> *)this_00);
    __end1 = std::vector<int,_std::allocator<int>_>::begin(pvVar7);
    cStack_f8 = std::vector<int,_std::allocator<int>_>::end(pvVar7);
    while (bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffff08), bVar1) {
      piVar9 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&__end1);
      pvVar2 = std::
               vector<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
               ::operator[](&this->rep_->node_io_,(long)*piVar9);
      OrderedSet<int>::Erase(&pvVar2->in,(int32_t)success_local);
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end1);
    }
    pvVar7 = OrderedSet<int>::GetSequence((OrderedSet<int> *)&__range1);
    __end1_1 = std::vector<int,_std::allocator<int>_>::begin(pvVar7);
    cStack_118 = std::vector<int,_std::allocator<int>_>::end(pvVar7);
    while (bVar1 = __gnu_cxx::operator!=(&__end1_1,&stack0xfffffffffffffee8), bVar1) {
      piVar9 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&__end1_1);
      pvVar2 = std::
               vector<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
               ::operator[](&this->rep_->node_io_,(long)*piVar9);
      OrderedSet<int>::Erase(&pvVar2->out,(int32_t)success_local);
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end1_1);
    }
    std::vector<int,_std::allocator<int>_>::push_back
              (&this->rep_->free_nodes_,(value_type_conflict1 *)&success_local);
    pvVar2 = std::
             vector<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
             ::operator[](&this->rep_->node_io_,(long)success_local._4_4_);
    pvVar8 = std::
             vector<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
             ::operator[](&this->rep_->node_io_,(long)success_local._4_4_);
    sVar3 = OrderedSet<int>::Size(&pvVar8->out);
    sVar4 = OrderedSet<int>::Size((OrderedSet<int> *)&in.value_to_index_._M_h._M_single_bucket);
    OrderedSet<int>::Reserve(&pvVar2->out,sVar3 + sVar4);
    pvVar7 = OrderedSet<int>::GetSequence
                       ((OrderedSet<int> *)&in.value_to_index_._M_h._M_single_bucket);
    __end1_2 = std::vector<int,_std::allocator<int>_>::begin(pvVar7);
    cStack_138 = std::vector<int,_std::allocator<int>_>::end(pvVar7);
    while (bVar1 = __gnu_cxx::operator!=(&__end1_2,&stack0xfffffffffffffec8), bVar1) {
      piVar9 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&__end1_2);
      InsertEdge(this,success_local._4_4_,*piVar9);
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end1_2);
    }
    pvVar2 = std::
             vector<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
             ::operator[](&this->rep_->node_io_,(long)success_local._4_4_);
    pvVar8 = std::
             vector<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
             ::operator[](&this->rep_->node_io_,(long)success_local._4_4_);
    sVar3 = OrderedSet<int>::Size(&pvVar8->in);
    sVar4 = OrderedSet<int>::Size((OrderedSet<int> *)&__range1);
    OrderedSet<int>::Reserve(&pvVar2->in,sVar3 + sVar4);
    pvVar7 = OrderedSet<int>::GetSequence((OrderedSet<int> *)&__range1);
    __end1_3 = std::vector<int,_std::allocator<int>_>::begin(pvVar7);
    cStack_158 = std::vector<int,_std::allocator<int>_>::end(pvVar7);
    while (bVar1 = __gnu_cxx::operator!=(&__end1_3,&stack0xfffffffffffffea8), bVar1) {
      piVar9 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&__end1_3);
      InsertEdge(this,*piVar9,success_local._4_4_);
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end1_3);
    }
    *success = true;
    this_local._4_4_ = success_local._4_4_;
    OrderedSet<int>::~OrderedSet((OrderedSet<int> *)&__range1);
    OrderedSet<int>::~OrderedSet((OrderedSet<int> *)&in.value_to_index_._M_h._M_single_bucket);
  }
  return this_local._4_4_;
}

Assistant:

int32_t GraphCycles::ContractEdge(int32_t a, int32_t b, bool &success) {
  assert(HasEdge(a, b) && "No edge exists from a to b");
  RemoveEdge(a, b);

  if (IsReachableNonConst(a, b)) {
    // Restore the graph to its original state.
    InsertEdge(a, b);
    success = false;
    return -1;
  }

  if (rep_->node_io_[b].in.Size() + rep_->node_io_[b].out.Size() >
      rep_->node_io_[a].in.Size() + rep_->node_io_[a].out.Size()) {
    // Swap "a" and "b" to minimize copying.
    std::swap(a, b);
  }

  NodeIO* nb_io = &rep_->node_io_[b];
  OrderedNodeSet out = std::move(nb_io->out);
  OrderedNodeSet in = std::move(nb_io->in);
  for (int32_t y : out.GetSequence()) {
    rep_->node_io_[y].in.Erase(b);
  }
  for (int32_t y : in.GetSequence()) {
    rep_->node_io_[y].out.Erase(b);
  }
  rep_->free_nodes_.push_back(b);

  rep_->node_io_[a].out.Reserve(rep_->node_io_[a].out.Size() + out.Size());
  for (int32_t y : out.GetSequence()) {
    InsertEdge(a, y);
  }

  rep_->node_io_[a].in.Reserve(rep_->node_io_[a].in.Size() + in.Size());
  for (int32_t y : in.GetSequence()) {
    InsertEdge(y, a);
  }

  // Note, if the swap happened it might be what originally was called "b".
  success = true;
  return a;
}